

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::AssignActiveReg(LinearScan *this,Lifetime *lifetime,RegNum reg)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegNum reg_local;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  BVar2 = BVUnitT<unsigned_long>::Test(&this->activeRegs,(uint)reg);
  if (BVar2 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe46,"(!this->activeRegs.Test(reg))","!this->activeRegs.Test(reg)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((*(ushort *)&lifetime->field_0x9c & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe47,"(!lifetime->isSpilled)","!lifetime->isSpilled");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((lifetime->reg != RegNOREG) && (lifetime->reg != reg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe48,"(lifetime->reg == RegNOREG || lifetime->reg == reg)",
                       "lifetime->reg == RegNOREG || lifetime->reg == reg");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVUnitT<unsigned_long>::Set(&this->func->m_regsUsed,(uint)reg);
  lifetime->reg = reg;
  BVUnitT<unsigned_long>::Set(&this->activeRegs,(uint)reg);
  bVar3 = Lifetime::IsInt(lifetime);
  if (bVar3) {
    this->intRegUsedCount = this->intRegUsedCount + 1;
  }
  else {
    this->floatRegUsedCount = this->floatRegUsedCount + 1;
  }
  AddToActive(this,lifetime);
  BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)reg);
  return;
}

Assistant:

void
LinearScan::AssignActiveReg(Lifetime * lifetime, RegNum reg)
{
    Assert(!this->activeRegs.Test(reg));
    Assert(!lifetime->isSpilled);
    Assert(lifetime->reg == RegNOREG || lifetime->reg == reg);
    this->func->m_regsUsed.Set(reg);
    lifetime->reg = reg;
    this->activeRegs.Set(reg);
    if (lifetime->IsInt())
    {
        this->intRegUsedCount++;
    }
    else
    {
        this->floatRegUsedCount++;
    }
    this->AddToActive(lifetime);

    this->tempRegs.Clear(reg);
}